

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.h
# Opt level: O2

size_t __thiscall merlin::factor::sample(factor *this)

{
  pointer pdVar1;
  ulong uVar2;
  ulong uVar3;
  size_t i;
  ulong uVar4;
  double dVar5;
  value vVar6;
  double dVar7;
  
  dVar5 = randu();
  vVar6 = sum(this);
  pdVar1 = (this->t_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = (long)(this->t_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar1 >> 3;
  dVar7 = 0.0;
  for (uVar4 = 0;
      (uVar3 = uVar2, uVar4 < uVar2 &&
      (dVar7 = dVar7 + pdVar1[uVar4], uVar3 = uVar4, dVar7 <= vVar6 * dVar5)); uVar4 = uVar4 + 1) {
  }
  return uVar3;
}

Assistant:

size_t sample() const {
		double x = 0.0, y = randu() * sum();
		for (size_t i = 0; i < num_states(); ++i)
			if ((x += t_[i]) > y)
				return i;
		return num_states();
	}